

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O1

optional<(anonymous_namespace)::VoicePos> *
anon_unknown.dwarf_55dd6::GetSampleOffset
          (optional<(anonymous_namespace)::VoicePos> *__return_storage_ptr__,
          BufferlistItem *BufferList,ALenum OffsetType,double Offset)

{
  uint *puVar1;
  char cVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ALuint AVar9;
  BufferStorage *pBVar10;
  bool bVar11;
  double dVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dbloff;
  double local_30;
  
  __return_storage_ptr__->mHasValue = false;
  *(undefined8 *)&__return_storage_ptr__->field_1 = 0;
  (__return_storage_ptr__->field_1).mValue.bufferitem = (BufferlistItem *)0x0;
  bVar11 = BufferList == (BufferlistItem *)0x0;
  while (!bVar11) {
    pBVar10 = BufferList->mBuffer;
    if (pBVar10 != (BufferStorage *)0x0) goto LAB_00128854;
    BufferList = (BufferList->mNext)._M_b._M_p;
    bVar11 = BufferList == (__pointer_type)0x0;
  }
  pBVar10 = (BufferStorage *)0x0;
LAB_00128854:
  if (bVar11) {
    return __return_storage_ptr__;
  }
  if (OffsetType == 0x1026) {
    cVar2 = *(char *)((long)&pBVar10[1].mData.
                             super__Vector_base<al::byte,_al::allocator<al::byte,_16UL>_>._M_impl.
                             super__Vector_impl_data._M_start + 4);
    if (cVar2 == -0x7f) {
      uVar4 = pBVar10->mAmbiOrder;
      iVar8 = (*(int *)((long)&pBVar10[1].mData.
                               super__Vector_base<al::byte,_al::allocator<al::byte,_16UL>_>._M_impl.
                               super__Vector_impl_data._M_finish + 4) - 2U >> 1) + 7;
    }
    else {
      if (cVar2 != -0x80) {
        uVar4 = ChannelsFromFmt(pBVar10->mChannels,pBVar10->mAmbiOrder);
        uVar6 = BytesFromFmt(pBVar10->mType);
        AVar9 = 0;
        uVar5 = (uint)(((long)Offset & 0xffffffffU) / (ulong)(uVar6 * uVar4));
        goto LAB_00128962;
      }
      uVar4 = pBVar10->mAmbiOrder;
      iVar8 = (*(int *)((long)&pBVar10[1].mData.
                               super__Vector_base<al::byte,_al::allocator<al::byte,_16UL>_>._M_impl.
                               super__Vector_impl_data._M_finish + 4) - 1U >> 1) + 4;
    }
    uVar4 = ChannelsFromFmt(pBVar10->mChannels,uVar4);
    AVar9 = 0;
    uVar5 = (int)(((long)Offset & 0xffffffffU) / (ulong)(uVar4 * iVar8)) *
            *(int *)((long)&pBVar10[1].mData.
                            super__Vector_base<al::byte,_al::allocator<al::byte,_16UL>_>._M_impl.
                            super__Vector_impl_data._M_finish + 4);
  }
  else {
    if (OffsetType != 0x1025) {
      AVar9 = 0;
      uVar5 = 0;
      if (OffsetType != 0x1024) goto LAB_00128962;
      Offset = (double)pBVar10->mSampleRate * Offset;
    }
    dVar12 = modf(Offset,&local_30);
    uVar13 = 0xffe00000;
    uVar14 = 0x41efffff;
    if (local_30 <= 4294967295.0) {
      uVar13 = SUB84(local_30,0);
      uVar14 = (undefined4)((ulong)local_30 >> 0x20);
    }
    uVar5 = (uint)(long)(double)CONCAT44(uVar14,uVar13);
    dVar3 = 4095.0;
    if (dVar12 * 4096.0 <= 4095.0) {
      dVar3 = dVar12 * 4096.0;
    }
    AVar9 = (ALuint)(long)dVar3;
  }
LAB_00128962:
  if (BufferList != (BufferlistItem *)0x0) {
    uVar7 = 0;
    while( true ) {
      puVar1 = &BufferList->mSampleLen;
      if (uVar5 - uVar7 < *puVar1) break;
      BufferList = (BufferList->mNext)._M_b._M_p;
      if (BufferList == (__pointer_type)0x0) {
        return __return_storage_ptr__;
      }
      uVar7 = uVar7 + *puVar1;
      if (uVar5 < uVar7) {
        return __return_storage_ptr__;
      }
    }
    (__return_storage_ptr__->field_1).mValue.pos = uVar5 - uVar7;
    (__return_storage_ptr__->field_1).mValue.frac = AVar9;
    (__return_storage_ptr__->field_1).mValue.bufferitem = BufferList;
    __return_storage_ptr__->mHasValue = true;
  }
  return __return_storage_ptr__;
}

Assistant:

al::optional<VoicePos> GetSampleOffset(BufferlistItem *BufferList, ALenum OffsetType,
    double Offset)
{
    al::optional<VoicePos> ret;

    /* Find the first valid Buffer in the Queue */
    const BufferStorage *BufferFmt{nullptr};
    while(BufferList)
    {
        if((BufferFmt=BufferList->mBuffer) != nullptr) break;
        BufferList = BufferList->mNext.load(std::memory_order_relaxed);
    }
    if(!BufferList)
        return ret;

    /* Get sample frame offset */
    ALuint offset{0u}, frac{0u};
    double dbloff, dblfrac;
    switch(OffsetType)
    {
    case AL_SEC_OFFSET:
        dblfrac = std::modf(Offset*BufferFmt->mSampleRate, &dbloff);
        offset = static_cast<ALuint>(mind(dbloff, std::numeric_limits<ALuint>::max()));
        frac = static_cast<ALuint>(mind(dblfrac*MixerFracOne, MixerFracOne-1.0));
        break;

    case AL_SAMPLE_OFFSET:
        dblfrac = std::modf(Offset, &dbloff);
        offset = static_cast<ALuint>(mind(dbloff, std::numeric_limits<ALuint>::max()));
        frac = static_cast<ALuint>(mind(dblfrac*MixerFracOne, MixerFracOne-1.0));
        break;

    case AL_BYTE_OFFSET:
        /* Determine the ByteOffset (and ensure it is block aligned) */
        const ALbuffer *origbuf{BufferFromStorage(BufferFmt)};
        offset = static_cast<ALuint>(Offset);
        if(origbuf->OriginalType == UserFmtIMA4)
        {
            const ALuint align{(origbuf->OriginalAlign-1)/2 + 4};
            offset /= align * origbuf->channelsFromFmt();
            offset *= origbuf->OriginalAlign;
        }
        else if(origbuf->OriginalType == UserFmtMSADPCM)
        {
            const ALuint align{(origbuf->OriginalAlign-2)/2 + 7};
            offset /= align * origbuf->channelsFromFmt();
            offset *= origbuf->OriginalAlign;
        }
        else
            offset /= BufferFmt->frameSizeFromFmt();
        frac = 0;
        break;
    }

    /* Find the bufferlist item this offset belongs to. */
    ALuint totalBufferLen{0u};
    while(BufferList && totalBufferLen <= offset)
    {
        if(BufferList->mSampleLen > offset-totalBufferLen)
        {
            /* Offset is in this buffer */
            ret = {offset-totalBufferLen, frac, BufferList};
            return ret;
        }
        totalBufferLen += BufferList->mSampleLen;

        BufferList = BufferList->mNext.load(std::memory_order_relaxed);
    }

    /* Offset is out of range of the queue */
    return ret;
}